

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O3

QString * __thiscall
QTest::Internal::formatTryTimeoutDebugMessage
          (QString *__return_storage_ptr__,Internal *this,QUtf8StringView expr,int timeout,
          int actual)

{
  long in_FS_OFFSET;
  QAnyStringView QVar1;
  QArrayData *local_d0;
  undefined8 local_c8;
  ulong local_c0;
  QArrayData *local_b8;
  undefined8 local_b0;
  ulong local_a8;
  undefined1 local_a0 [8];
  undefined8 local_98;
  ulong local_90;
  undefined1 local_88 [8];
  undefined8 local_80;
  ulong local_78;
  undefined1 local_70 [8];
  Internal *local_68;
  storage_type *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined8 local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QString::number((int)&local_b8,(int)expr.m_size);
  QString::number((int)&local_d0,timeout);
  local_58 = local_70;
  local_70[0] = 1;
  local_78 = local_a8 | 0x8000000000000000;
  local_50 = local_88;
  local_88[0] = 1;
  local_80 = local_b0;
  local_90 = local_c0 | 0x8000000000000000;
  local_48 = local_a0;
  local_a0[0] = 1;
  local_98 = local_c8;
  local_40 = 0;
  QVar1.m_size = (size_t)
                 "QTestLib: This test case check (\"%1\") failed because the requested timeout (%2 ms) was too short, %3 ms would have been sufficient this time."
  ;
  QVar1.field_0.m_data = __return_storage_ptr__;
  local_68 = this;
  local_60 = expr.m_data;
  QtPrivate::argToQString(QVar1,0x400000000000008d,(ArgBase **)0x3);
  if (local_d0 != (QArrayData *)0x0) {
    LOCK();
    (local_d0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_d0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_d0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_d0,2,0x10);
    }
  }
  if (local_b8 != (QArrayData *)0x0) {
    LOCK();
    (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_b8,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString Internal::formatTryTimeoutDebugMessage(q_no_char8_t::QUtf8StringView expr, int timeout, int actual)
{
    return "QTestLib: This test case check (\"%1\") failed because the requested timeout (%2 ms) "
           "was too short, %3 ms would have been sufficient this time."_L1
            .arg(expr, QString::number(timeout), QString::number(actual));
}